

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O2

BOOLEAN __thiscall BVStatic<2048UL>::TestAndClear(BVStatic<2048UL> *this,BVIndex i)

{
  BOOLEAN BVar1;
  BVUnit *this_00;
  
  AssertRange(this,i);
  this_00 = BitsFromIndex(this,i);
  BVar1 = BVUnitT<unsigned_long>::Test(this_00,i & 0x3f);
  BVUnitT<unsigned_long>::Clear(this_00,i & 0x3f);
  return BVar1;
}

Assistant:

BOOLEAN TestAndClear(BVIndex i)
    {
        AssertRange(i);
        BVUnit * bvUnit = this->BitsFromIndex(i);
        BVIndex offset = BVUnit::Offset(i);
        BOOLEAN bit = bvUnit->Test(offset);
        bvUnit->Clear(offset);
        return bit;
    }